

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_ptr.hpp
# Opt level: O3

element_type * __thiscall
nonstd::vptr::
value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_nonstd::vptr::detail::default_delete<int>_>
::value(value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_nonstd::vptr::detail::default_delete<int>_>
        *this)

{
  element_type *peVar1;
  logic_error *this_00;
  bad_value_access local_20;
  
  peVar1 = (this->ptr).ptr;
  if (peVar1 != (element_type *)0x0) {
    return peVar1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  bad_value_access::bad_value_access(&local_20);
  std::logic_error::logic_error(this_00,&local_20.super_logic_error);
  *(undefined ***)this_00 = &PTR__logic_error_0018bd08;
  __cxa_throw(this_00,&bad_value_access::typeinfo,std::logic_error::~logic_error);
}

Assistant:

pointer get() const nsvp_noexcept
    {
        return ptr;
    }